

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationSpeed::ConstraintsBiLoad_Ct(ChLinkMotorRotationSpeed *this,double factor)

{
  undefined1 auVar1 [16];
  char cVar2;
  ChConstraintTwoBodies *pCVar3;
  ChConstraintTwoBodies *pCVar4;
  ChLinkMask *this_00;
  int i;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  cVar2 = (**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                                 super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                 super_ChLinkBase.super_ChPhysicsItem + 0x48))();
  if (cVar2 != '\0') {
    dVar5 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
            super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
    (*((this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func.
       super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ChFunction
      [4])();
    this_00 = &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask;
    i = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr +
        -1;
    pCVar3 = ChLinkMask::Constr_N(this_00,i);
    if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar3 = ChLinkMask::Constr_N(this_00,i);
      pCVar4 = ChLinkMask::Constr_N(this_00,i);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = factor;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar5 * -0.5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (pCVar4->super_ChConstraintTwo).super_ChConstraint.b_i;
      auVar1 = vfmadd213sd_fma(auVar7,auVar6,auVar1);
      (pCVar3->super_ChConstraintTwo).super_ChConstraint.b_i = auVar1._0_8_;
    }
  }
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::ConstraintsBiLoad_Ct(double factor) {
    if (!this->IsActive())
        return;

    double mCt = -0.5 * m_func->Get_y(this->GetChTime());
    int ncrz = mask.nconstr - 1;
    if (mask.Constr_N(ncrz).IsActive()) {
        mask.Constr_N(ncrz).Set_b_i(mask.Constr_N(ncrz).Get_b_i() + factor * mCt);
    }
}